

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double b;
  char cVar1;
  cJSON_bool cVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  uchar *puVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  size_t needed;
  long lVar9;
  cJSON *item_00;
  cJSON *pcVar10;
  size_t needed_00;
  double local_50;
  uchar number_buffer [26];
  
  cVar2 = 0;
  if (output_buffer == (printbuffer *)0x0 || item == (cJSON *)0x0) {
    return 0;
  }
  cVar1 = (char)item->type;
  switch(cVar1) {
  case '\x01':
    puVar6 = ensure(output_buffer,6);
    if (puVar6 == (uchar *)0x0) {
      return 0;
    }
    builtin_memcpy(puVar6,"false",6);
    break;
  case '\x02':
    puVar6 = ensure(output_buffer,5);
    if (puVar6 == (uchar *)0x0) {
      return 0;
    }
    builtin_memcpy(puVar6,"true",5);
    break;
  case '\x03':
  case '\x05':
  case '\x06':
  case '\a':
    goto switchD_0010ad86_caseD_3;
  case '\x04':
    puVar6 = ensure(output_buffer,5);
    if (puVar6 == (uchar *)0x0) {
      return 0;
    }
    builtin_memcpy(puVar6,"null",5);
    break;
  case '\b':
    b = item->valuedouble;
    number_buffer[0x10] = '\0';
    number_buffer[0x11] = '\0';
    number_buffer[0x12] = '\0';
    number_buffer[0x13] = '\0';
    number_buffer[0x14] = '\0';
    number_buffer[0x15] = '\0';
    number_buffer[0x16] = '\0';
    number_buffer[0x17] = '\0';
    number_buffer[0x18] = '\0';
    number_buffer[0x19] = '\0';
    local_50 = 0.0;
    number_buffer[0] = '\0';
    number_buffer[1] = '\0';
    number_buffer[2] = '\0';
    number_buffer[3] = '\0';
    number_buffer[4] = '\0';
    number_buffer[5] = '\0';
    number_buffer[6] = '\0';
    number_buffer[7] = '\0';
    number_buffer[8] = '\0';
    number_buffer[9] = '\0';
    number_buffer[10] = '\0';
    number_buffer[0xb] = '\0';
    number_buffer[0xc] = '\0';
    number_buffer[0xd] = '\0';
    number_buffer[0xe] = '\0';
    number_buffer[0xf] = '\0';
    if ((ulong)ABS(b) < 0x7ff0000000000000) {
      if ((b != (double)item->valueint) || (NAN(b) || NAN((double)item->valueint))) {
        uVar3 = sprintf((char *)number_buffer,"%1.15g");
        iVar4 = __isoc99_sscanf(number_buffer,"%lg",&local_50);
        if ((iVar4 != 1) || (cVar2 = compare_double(local_50,b), cVar2 == 0)) {
          uVar3 = sprintf((char *)number_buffer,"%1.17g",b);
        }
      }
      else {
        uVar3 = sprintf((char *)number_buffer,"%d");
      }
      uVar7 = (ulong)uVar3;
      if (0x19 < uVar3) {
        return 0;
      }
    }
    else {
      builtin_memcpy(number_buffer,"null",5);
      number_buffer[5] = '\0';
      number_buffer[6] = '\0';
      number_buffer[7] = '\0';
      uVar7 = 4;
    }
    puVar6 = ensure(output_buffer,uVar7 + 1);
    if (puVar6 == (uchar *)0x0) {
      return 0;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      puVar6[uVar8] = number_buffer[uVar8];
    }
    puVar6[uVar7] = '\0';
    output_buffer->offset = output_buffer->offset + uVar7;
    break;
  default:
    if (cVar1 == '\x10') {
      cVar2 = print_string_ptr((uchar *)item->valuestring,output_buffer);
      return cVar2;
    }
    if (cVar1 == ' ') {
      pcVar10 = item->child;
      puVar6 = ensure(output_buffer,1);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      *puVar6 = '[';
      output_buffer->offset = output_buffer->offset + 1;
      output_buffer->depth = output_buffer->depth + 1;
      while (item_00 = pcVar10, item_00 != (cJSON *)0x0) {
        cVar2 = print_value(item_00,output_buffer);
        if (cVar2 == 0) {
          return 0;
        }
        update_offset(output_buffer);
        pcVar10 = (cJSON *)0x0;
        if (item_00->next != (cJSON *)0x0) {
          uVar7 = (ulong)(output_buffer->format == 0);
          puVar6 = ensure(output_buffer,uVar7 ^ 3);
          if (puVar6 == (uchar *)0x0) {
            return 0;
          }
          *puVar6 = ',';
          if (output_buffer->format == 0) {
            puVar6 = puVar6 + 1;
          }
          else {
            puVar6[1] = ' ';
            puVar6 = puVar6 + 2;
          }
          *puVar6 = '\0';
          output_buffer->offset = output_buffer->offset + (2 - uVar7);
          pcVar10 = item_00->next;
        }
      }
      puVar6 = ensure(output_buffer,2);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      puVar6[0] = ']';
      puVar6[1] = '\0';
    }
    else {
      if (cVar1 != '@') {
        if (cVar1 != -0x80) {
          return 0;
        }
        if (item->valuestring == (char *)0x0) {
          return 0;
        }
        sVar5 = strlen(item->valuestring);
        puVar6 = ensure(output_buffer,sVar5 + 1);
        if (puVar6 == (uchar *)0x0) {
          return 0;
        }
        memcpy(puVar6,item->valuestring,sVar5 + 1);
        break;
      }
      pcVar10 = item->child;
      uVar7 = (ulong)(output_buffer->format == 0);
      puVar6 = ensure(output_buffer,uVar7 ^ 3);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      needed_00 = 2;
      *puVar6 = '{';
      output_buffer->depth = output_buffer->depth + 1;
      if (output_buffer->format != 0) {
        puVar6[1] = '\n';
      }
      output_buffer->offset = output_buffer->offset + (2 - uVar7);
      for (; pcVar10 != (cJSON *)0x0; pcVar10 = pcVar10->next) {
        if (output_buffer->format != 0) {
          puVar6 = ensure(output_buffer,output_buffer->depth);
          if (puVar6 == (uchar *)0x0) {
            return 0;
          }
          for (uVar7 = 0; uVar7 < output_buffer->depth; uVar7 = uVar7 + 1) {
            puVar6[uVar7] = '\t';
          }
          output_buffer->offset = output_buffer->offset + output_buffer->depth;
        }
        cVar2 = print_string_ptr((uchar *)pcVar10->string,output_buffer);
        if (cVar2 == 0) {
          return 0;
        }
        update_offset(output_buffer);
        needed = 2 - (ulong)(output_buffer->format == 0);
        puVar6 = ensure(output_buffer,needed);
        if (puVar6 == (uchar *)0x0) {
          return 0;
        }
        *puVar6 = ':';
        if (output_buffer->format != 0) {
          puVar6[1] = '\t';
        }
        output_buffer->offset = output_buffer->offset + needed;
        cVar2 = print_value(pcVar10,output_buffer);
        if (cVar2 == 0) {
          return 0;
        }
        update_offset(output_buffer);
        lVar9 = ((ulong)(pcVar10->next != (cJSON *)0x0) + 1) - (ulong)(output_buffer->format == 0);
        puVar6 = ensure(output_buffer,lVar9 + 1);
        if (puVar6 == (uchar *)0x0) {
          return 0;
        }
        if (pcVar10->next != (cJSON *)0x0) {
          *puVar6 = ',';
          puVar6 = puVar6 + 1;
        }
        if (output_buffer->format != 0) {
          *puVar6 = '\n';
          puVar6 = puVar6 + 1;
        }
        *puVar6 = '\0';
        output_buffer->offset = output_buffer->offset + lVar9;
      }
      if (output_buffer->format != 0) {
        needed_00 = output_buffer->depth + 1;
      }
      puVar6 = ensure(output_buffer,needed_00);
      if (puVar6 == (uchar *)0x0) {
        return 0;
      }
      if (output_buffer->format != 0) {
        for (uVar7 = 0; uVar7 < output_buffer->depth - 1; uVar7 = uVar7 + 1) {
          puVar6[uVar7] = '\t';
        }
        puVar6 = puVar6 + uVar7;
      }
      puVar6[0] = '}';
      puVar6[1] = '\0';
    }
    output_buffer->depth = output_buffer->depth - 1;
  }
  cVar2 = 1;
switchD_0010ad86_caseD_3:
  return cVar2;
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}